

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

void stb_free(void *p)

{
  void **ppvVar1;
  stb__chunk *psVar2;
  stb__alloc_type sVar3;
  long *__ptr;
  undefined8 *__ptr_00;
  void ***pppvVar4;
  void *q;
  stb__chunk *n;
  stb__chunk *c;
  stb__alloc *s_1;
  stb__nochildren *s;
  void *p_local;
  
  if (p != (void *)0x0) {
    stb_alloc_count_free = stb_alloc_count_free + 1;
    sVar3 = stb__identify(p);
    if (sVar3 == STB__nochildren) {
      __ptr = (long *)((long)p + -0x10);
      **(long **)((long)p + -8) = *__ptr;
      if (*__ptr != 0) {
        ppvVar1 = *(void ***)((long)p + -8);
        pppvVar4 = stb__prevn((void *)*__ptr);
        *pppvVar4 = ppvVar1;
      }
      free(__ptr);
    }
    else if (sVar3 != STB__chunked) {
      if (sVar3 != STB__alloc) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                      ,0xa23,"void stb_free(void *)");
      }
      __ptr_00 = (undefined8 *)((long)p + -0x20);
      *(undefined8 *)*__ptr_00 = *(undefined8 *)((long)p + -0x10);
      if (*(long *)((long)p + -0x10) != 0) {
        ppvVar1 = (void **)*__ptr_00;
        pppvVar4 = stb__prevn(*(void **)((long)p + -0x10));
        *pppvVar4 = ppvVar1;
      }
      n = (stb__chunk *)(*(long *)((long)p + -8) + -2);
      while (n != (stb__chunk *)0x0) {
        psVar2 = n->next;
        stb_alloc_count_free = n->alloc + stb_alloc_count_free;
        free(n);
        n = psVar2;
      }
      *(undefined8 *)((long)p + -8) = 2;
      *__ptr_00 = 0;
      *(undefined8 *)((long)p + -0x10) = 0;
      while (*(void **)((long)p + -0x18) != (void *)0x0) {
        stb_free(*(void **)((long)p + -0x18));
      }
      free(__ptr_00);
    }
  }
  return;
}

Assistant:

void stb_free(void *p)
{
   if (p == NULL) return;

   // count frees so that unit tests can see what's happening
   ++stb_alloc_count_free;

   switch(stb__identify(p)) {
      case STB__chunked:
         // freeing a chunked-block with children does nothing;
         // they only get freed when the parent does
         // surely this is wrong, and it should free them immediately?
         // otherwise how are they getting put on the right chain?
         return;
      case STB__nochildren: {
         stb__nochildren *s = (stb__nochildren *) p - 1;
         // unlink from sibling chain
         *(s->prevn) = s->next;
         if (s->next)
            *stb__prevn(s->next) = s->prevn;
         free(s);
         return;
      }
      case STB__alloc: {
         stb__alloc *s = (stb__alloc *) p - 1;
         stb__chunk *c, *n;
         void *q;

         // unlink from sibling chain, if any
         *(s->prevn) = s->next;
         if (s->next)
            *stb__prevn(s->next) = s->prevn;

         // first free chunks
         c = (stb__chunk *) stb__chunks(s);
         while (c != NULL) {
            n = c->next;
            stb_alloc_count_free += c->alloc;
            free(c);
            c = n;
         }

         // validating
         stb__setchunks(s,NULL);
         s->prevn = NULL;
         s->next = NULL;

         // now free children
         while ((q = s->child) != NULL) {
            stb_free(q);
         }

         // now free self
         free(s);
         return;
      }
      default:
         assert(0); /* NOTREACHED */
   }
}